

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  xcard local_d0;
  size_t i;
  undefined1 local_88 [8];
  xcard xc;
  string local_50 [8];
  string _dbg_option;
  string local_30 [8];
  string prefix_input;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::operator<<((ostream *)&std::cout,"Enter Prefix (Upto 15 digits): ");
  std::operator>>((istream *)&std::cin,local_30);
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 0x10) {
    std::operator<<((ostream *)&std::cout,"Enable Debug Messages [Y/N]: ");
    std::operator>>((istream *)&std::cin,local_50);
    std::__cxx11::string::string((string *)&i,local_30);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"Y");
    xcard::xcard((xcard *)local_88,(string *)&i,(uint)bVar1);
    std::__cxx11::string::~string((string *)&i);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(float)xc._28_4_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_d0.debug = 0;
    local_d0.VERSION = 0.0;
    for (; (ulong)local_d0._32_8_ < 10; local_d0._32_8_ = local_d0._32_8_ + 1) {
      xcard::generateCard_abi_cxx11_(&local_d0);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_d0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    xcard::~xcard((xcard *)local_88);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_30);
    return 0;
  }
  __assert_fail("prefix_input.length() < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jkotra[P]xcard/src/demo.cpp"
                ,0xe,"int main()");
}

Assistant:

int main()
{

    std::string prefix_input;
    std::string _dbg_option;

    std::cout << "Enter Prefix (Upto 15 digits): ";
    std::cin >> prefix_input;
    assert(prefix_input.length() < 16);
    
    std::cout << "Enable Debug Messages [Y/N]: ";
    std::cin >> _dbg_option;

    xcard xc(prefix_input, _dbg_option == "Y" ? true : false);
    std::cout << xc.VERSION << std::endl;

    for (size_t i = 0; i < 10; i++)
    {
        std::cout << xc.generateCard() << std::endl; 
    }

    return 0;
}